

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

int __thiscall
SVGChart::PlotDataContainer::GetPlotIndexByName(PlotDataContainer *this,string *inName)

{
  pointer ppLVar1;
  pointer __s2;
  size_t __n;
  LegendData *pLVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  bVar3 = CheckState(this);
  if (bVar3) {
    ppLVar1 = (this->mLegendDataList).
              super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(this->mLegendDataList).
                                 super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1) >> 3);
    if (0 < (int)uVar6) {
      __s2 = (inName->_M_dataplus)._M_p;
      __n = inName->_M_string_length;
      uVar5 = 0;
      do {
        pLVar2 = ppLVar1[uVar5];
        if (((pLVar2->mName)._M_string_length == __n) &&
           ((__n == 0 || (iVar4 = bcmp((pLVar2->mName)._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) {
          return (int)uVar5;
        }
        uVar5 = uVar5 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar5);
    }
  }
  return -1;
}

Assistant:

int PlotDataContainer::GetPlotIndexByName (const string &inName) const {

      if (CheckState ()) {
        for (int theI = 0; theI < int(mLegendDataList.size());theI++) {
          LegendData *theLegendData = mLegendDataList[theI];
          if (theLegendData->mName == inName) {
            return theI;
          }
        }
      }
      return -1;
    }